

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  size_t sStack_60;
  int id;
  int len;
  char vstr [16];
  
  clear(this);
  id = 0;
  while( true ) {
    while( true ) {
      iVar2 = (**(code **)(*(long *)dr + 0x10))(dr,"%d=",&id);
      if (iVar2 != 1) {
        return 0;
      }
      if (id < -0x5b03) break;
      iVar2 = (**(code **)(*(long *)dr + 0x10))(dr,"%15s",vstr);
      if (iVar2 != 1) {
        pcVar5 = "ParamDict read value failed\n";
        sStack_60 = 0x1c;
        goto LAB_0011a783;
      }
      bVar1 = vstr_is_float(vstr);
      pcVar5 = "%d";
      if (bVar1) {
        pcVar5 = "%f";
      }
      iVar2 = __isoc99_sscanf(vstr,pcVar5,&this->params[id].field_1);
      if (iVar2 != 1) {
        pcVar5 = "ParamDict parse value failed\n";
        sStack_60 = 0x1d;
        goto LAB_0011a783;
      }
      this->params[id].type = bVar1 | 2;
    }
    id = -0x5b04 - id;
    len = 0;
    iVar2 = (**(code **)(*(long *)dr + 0x10))(dr,"%d",&len);
    if (iVar2 != 1) break;
    Mat::create(&this->params[id].v,len,4,(Allocator *)0x0);
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < len; lVar3 = lVar3 + 1) {
      iVar2 = (**(code **)(*(long *)dr + 0x10))(dr,",%15[^,\n ]",vstr);
      if (iVar2 != 1) {
        pcVar5 = "ParamDict read array element failed\n";
        sStack_60 = 0x24;
        goto LAB_0011a783;
      }
      bVar1 = vstr_is_float(vstr);
      if (bVar1) {
        pcVar5 = "%f";
      }
      else {
        pcVar5 = "%d";
      }
      iVar2 = __isoc99_sscanf(vstr,pcVar5,(long)this->params[id].v.data + lVar4);
      if (iVar2 != 1) {
        pcVar5 = "ParamDict parse array element failed\n";
        sStack_60 = 0x25;
        goto LAB_0011a783;
      }
      this->params[id].type = bVar1 + 5;
      lVar4 = lVar4 + 4;
    }
  }
  pcVar5 = "ParamDict read array length failed\n";
  sStack_60 = 0x23;
LAB_0011a783:
  fwrite(pcVar5,sStack_60,1,_stderr);
  return -1;
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

//     0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read array length failed\n");
                return -1;
            }

            params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict read array element failed\n");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = params[id].v;
                    nscan = sscanf(vstr, "%f", &ptr[j]);
                }
                else
                {
                    int* ptr = params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                }
                if (nscan != 1)
                {
                    fprintf(stderr, "ParamDict parse array element failed\n");
                    return -1;
                }

                params[id].type = is_float ? 6 : 5;
            }
        }
        else
        {
            char vstr[16];
            int nscan = dr.scan("%15s", vstr);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict read value failed\n");
                return -1;
            }

            bool is_float = vstr_is_float(vstr);

            if (is_float)
                nscan = sscanf(vstr, "%f", &params[id].f);
            else
                nscan = sscanf(vstr, "%d", &params[id].i);
            if (nscan != 1)
            {
                fprintf(stderr, "ParamDict parse value failed\n");
                return -1;
            }

            params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}